

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::_::XThreadEvent_*> * __thiscall
kj::ArrayBuilder<kj::_::XThreadEvent_*>::operator=
          (ArrayBuilder<kj::_::XThreadEvent_*> *this,ArrayBuilder<kj::_::XThreadEvent_*> *other)

{
  RemoveConst<kj::_::XThreadEvent_*> *ppXVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  ppXVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppXVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (XThreadEvent **)0x0;
  other->pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
  other->endPtr = (XThreadEvent **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }